

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_allocators.h
# Opt level: O3

void * __thiscall
density_tests::UnmovableFastTestAllocator<65536UL>::try_allocate_page
          (UnmovableFastTestAllocator<65536UL> *this,progress_guarantee i_progress_guarantee)

{
  void *pvVar1;
  long *in_FS_OFFSET;
  
  density::detail::PageAllocator<density::detail::SystemPageManager<65536ul>>::t_instance::
  __tls_init();
  pvVar1 = density::detail::PageAllocator<density::detail::SystemPageManager<65536UL>_>::
           try_allocate_page<(density::detail::page_allocation_type)0>
                     ((PageAllocator<density::detail::SystemPageManager<65536UL>_> *)
                      (*in_FS_OFFSET + -0xc0),i_progress_guarantee);
  if (pvVar1 != (void *)0x0) {
    LOCK();
    (this->m_living_pages).super___atomic_base<unsigned_long>._M_i =
         (this->m_living_pages).super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
    LOCK();
    (this->m_total_allocated_pages).super___atomic_base<unsigned_long>._M_i =
         (this->m_total_allocated_pages).super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
    if ((short)pvVar1 != 0) {
      detail::assert_failed<>
                ("density::address_is_aligned(result, page_alignment)",
                 "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/generic_tests/../../test_framework/test_allocators.h"
                 ,0x172);
    }
  }
  return pvVar1;
}

Assistant:

void * try_allocate_page(density::progress_guarantee i_progress_guarantee)
        {
            auto const result = Base::try_allocate_page(i_progress_guarantee);
            if (result)
            {
                m_living_pages.fetch_add(1, std::memory_order_relaxed);
                m_total_allocated_pages.fetch_add(1, std::memory_order_relaxed);
                DENSITY_TEST_ASSERT(density::address_is_aligned(result, page_alignment));
            }
            return result;
        }